

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHHasDuplicateConfigID_Test::TestBody
          (SSLTest_ECHHasDuplicateConfigID_Test *this)

{
  uint8_t config_id;
  uint8_t *puVar1;
  void *pvVar2;
  int iVar3;
  EVP_HPKE_KEM *kem;
  pointer *__ptr;
  char *message;
  char *in_R9;
  uint8_t *puVar4;
  long lVar5;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  uint8_t *ech_config;
  UniquePtr<uint8_t> free_ech_config;
  size_t ech_config_len;
  UniquePtr<SSL_ECH_KEYS> keys;
  ScopedEVP_HPKE_KEY key;
  AssertHelper local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_178;
  AssertHelper local_170;
  _Head_base<0UL,_unsigned_char_*,_false> local_168;
  undefined1 local_160 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  AssertHelper local_140;
  _Head_base<0UL,_ssl_ech_keys_st_*,_false> local_138;
  AssertHelper local_130;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [4];
  long alStack_d8 [5];
  undefined8 uStack_b0;
  undefined1 uStack_a8;
  undefined8 uStack_a7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  undefined1 local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  undefined1 local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined1 local_40;
  
  uStack_a8 = 0;
  uStack_a7 = 0;
  alStack_d8[4] = 0;
  uStack_b0._0_1_ = 0;
  uStack_b0._1_7_ = 0;
  local_188.data_._0_4_ = CONCAT31(local_188.data_._1_3_,1);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_188;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_98,__l,(allocator_type *)&local_138);
  local_80 = 0;
  local_128._0_4_ = 0xff030201;
  __l_00._M_len = 4;
  __l_00._M_array = local_128;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_78,__l_00,(allocator_type *)&local_178);
  local_60 = 0;
  local_160._0_4_ = 0x1030201;
  __l_01._M_len = 4;
  __l_01._M_array = local_160;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_58,__l_01,(allocator_type *)&local_140);
  local_40 = 1;
  lVar5 = 0;
  do {
    local_138._M_head_impl = SSL_ECH_KEYS_new();
    local_160[0] = local_138._M_head_impl != (SSL_ECH_KEYS *)0x0;
    local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_138._M_head_impl == (SSL_ECH_KEYS *)0x0) {
      testing::Message::Message((Message *)&local_188);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_128,(internal *)local_160,(AssertionResult *)0x338821,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_178,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x7b7,(char *)CONCAT44(local_128._4_4_,local_128._0_4_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_188);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_128._4_4_,local_128._0_4_) != local_118) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_128._4_4_,local_128._0_4_),
                        local_118[0]._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_188.data_._4_4_,(int)local_188.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_188.data_._4_4_,(int)local_188.data_) + 8))();
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
LAB_001636d0:
      std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&local_138);
      break;
    }
    puVar1 = *(uint8_t **)((long)&uStack_b0 + lVar5);
    for (puVar4 = *(uint8_t **)((long)alStack_d8 + lVar5 + 0x20); puVar4 != puVar1;
        puVar4 = puVar4 + 1) {
      config_id = *puVar4;
      EVP_HPKE_KEY_zero((EVP_HPKE_KEY *)local_128);
      kem = EVP_hpke_x25519_hkdf_sha256();
      iVar3 = EVP_HPKE_KEY_generate((EVP_HPKE_KEY *)local_128,kem);
      local_188.data_._0_4_ = CONCAT31(local_188.data_._1_3_,iVar3 != 0);
      local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_160,(internal *)&local_188,
                   (AssertionResult *)
                   "EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x7bb,(char *)CONCAT44(local_160._4_4_,local_160._0_4_));
        testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_178);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_160._4_4_,local_160._0_4_) != &local_150) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_160._4_4_,local_160._0_4_),
                          local_150._M_allocated_capacity + 1);
        }
        if (local_178._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_178._M_head_impl + 8))();
        }
        if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_180,local_180);
        }
        EVP_HPKE_KEY_cleanup((EVP_HPKE_KEY *)local_128);
        goto LAB_001636d0;
      }
      in_R9 = &DAT_00000010;
      iVar3 = SSL_marshal_ech_config
                        ((uint8_t **)&local_178,(size_t *)&local_140,config_id,
                         (EVP_HPKE_KEY *)local_128,"public.example",0x10);
      local_188.data_._0_4_ = CONCAT31(local_188.data_._1_3_,iVar3 != 0);
      local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_168);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_160,(internal *)&local_188,
                   (AssertionResult *)
                   "SSL_marshal_ech_config(&ech_config, &ech_config_len, id, key.get(), \"public.example\", 16)"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x7bf,(char *)CONCAT44(local_160._4_4_,local_160._0_4_));
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_160._4_4_,local_160._0_4_) != &local_150) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_160._4_4_,local_160._0_4_),
                          local_150._M_allocated_capacity + 1);
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_168._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
        if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_180,local_180);
        }
        EVP_HPKE_KEY_cleanup((EVP_HPKE_KEY *)local_128);
        goto LAB_001636d0;
      }
      local_168._M_head_impl = (uchar *)local_178._M_head_impl;
      iVar3 = SSL_ECH_KEYS_add(local_138._M_head_impl,1,(uint8_t *)local_178._M_head_impl,
                               (size_t)local_140.data_,(EVP_HPKE_KEY *)local_128);
      local_188.data_._0_4_ = CONCAT31(local_188.data_._1_3_,iVar3 != 0);
      local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_170);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_160,(internal *)&local_188,
                   (AssertionResult *)
                   "SSL_ECH_KEYS_add(keys.get(), 1, ech_config, ech_config_len, key.get())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x7c2,(char *)CONCAT44(local_160._4_4_,local_160._0_4_));
        testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_160._4_4_,local_160._0_4_) != &local_150) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_160._4_4_,local_160._0_4_),
                          local_150._M_allocated_capacity + 1);
        }
        if (local_170.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_170.data_ + 8))();
        }
        if (local_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_180,local_180);
        }
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_168);
        EVP_HPKE_KEY_cleanup((EVP_HPKE_KEY *)local_128);
        goto LAB_001636d0;
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_168);
      EVP_HPKE_KEY_cleanup((EVP_HPKE_KEY *)local_128);
    }
    local_160._0_4_ = ZEXT14(*(byte *)((long)&uStack_a7 + lVar5 + 7));
    local_188.data_._0_4_ = SSL_ECH_KEYS_has_duplicate_config_id(local_138._M_head_impl);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_128,"test.has_duplicate ? 1 : 0",
               "SSL_ECH_KEYS_has_duplicate_config_id(keys.get())",(int *)local_160,(int *)&local_188
              );
    if (local_128[0] == '\0') {
      testing::Message::Message((Message *)local_160);
      message = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((_Alloc_hider *)local_128._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x7c6,message);
      testing::internal::AssertHelper::operator=(&local_188,(Message *)local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_188);
      if ((long *)CONCAT44(local_160._4_4_,local_160._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_160._4_4_,local_160._0_4_) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_128 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_128._8_8_);
    }
    std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&local_138);
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x80);
  lVar5 = 0x80;
  do {
    pvVar2 = *(void **)((long)alStack_d8 + lVar5);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)alStack_d8 + lVar5 + 0x10) - (long)pvVar2);
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != 0);
  return;
}

Assistant:

TEST(SSLTest, ECHHasDuplicateConfigID) {
  const struct {
    std::vector<uint8_t> ids;
    bool has_duplicate;
  } kTests[] = {
      {{}, false},
      {{1}, false},
      {{1, 2, 3, 255}, false},
      {{1, 2, 3, 1}, true},
  };
  for (const auto &test : kTests) {
    bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
    ASSERT_TRUE(keys);
    for (const uint8_t id : test.ids) {
      bssl::ScopedEVP_HPKE_KEY key;
      ASSERT_TRUE(
          EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));
      uint8_t *ech_config;
      size_t ech_config_len;
      ASSERT_TRUE(SSL_marshal_ech_config(&ech_config, &ech_config_len, id,
                                         key.get(), "public.example", 16));
      bssl::UniquePtr<uint8_t> free_ech_config(ech_config);
      ASSERT_TRUE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                   ech_config, ech_config_len, key.get()));
    }

    EXPECT_EQ(test.has_duplicate ? 1 : 0,
              SSL_ECH_KEYS_has_duplicate_config_id(keys.get()));
  }
}